

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

unsigned_long * __thiscall
google::protobuf::Reflection::GetRaw<unsigned_long>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 uVar2;
  unsigned_long *puVar3;
  
  if (*(long *)(field + 0x58) != 0) {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) {
      puVar3 = (unsigned_long *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
      return puVar3;
    }
  }
  uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  return (unsigned_long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}